

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O3

Gia_Man_t * Acec_ManDerive(Gia_Man_t *p,Vec_Int_t *vMirrors)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x4a,"Gia_Man_t *Acec_ManDerive(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar9->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006614ac;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_006614cb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_006614cb;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar10 = (int)uVar11;
      iVar1 = pVVar9->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006614ac;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Acec_ManDerive_rec(p_00,p,iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff),vMirrors);
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
      iVar10 = pVVar9->nSize;
      uVar11 = (ulong)iVar10;
    } while (lVar12 < (long)uVar11);
    if (0 < iVar10) {
      lVar12 = 0;
      do {
        iVar1 = pVVar9->pArray[lVar12];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006614ac:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar5;
        lVar12 = lVar12 + 1;
        pVVar9 = p->vCos;
      } while (lVar12 < pVVar9->nSize);
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Acec_ManDerive( Gia_Man_t * p, Vec_Int_t * vMirrors )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes == NULL );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0p(p, pObj), vMirrors );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}